

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmap.c
# Opt level: O3

void mkmap(level *lev,lev_init *init_lev)

{
  mkroom *__s;
  char cVar1;
  char btyp;
  char cVar2;
  char cVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  long lVar27;
  undefined1 auVar28 [16];
  byte bVar29;
  boolean bVar30;
  uint uVar31;
  undefined1 *puVar32;
  mkroom *pmVar33;
  int i;
  uint uVar34;
  long lVar35;
  char *pcVar36;
  bool bVar37;
  int j;
  int iVar38;
  long lVar39;
  schar *psVar40;
  long lVar41;
  ulong uVar42;
  char cVar43;
  mkroom *croom;
  level *plVar44;
  char cVar45;
  long lVar46;
  char *pcVar47;
  undefined1 *puVar48;
  short sVar49;
  int y;
  schar sVar50;
  uint uVar51;
  uint uVar52;
  char cVar53;
  int iVar64;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  int iVar65;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int iVar85;
  undefined1 auVar83 [16];
  int iVar86;
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  int iVar100;
  int iVar104;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  coord local_7c;
  coord sm;
  
  cVar1 = init_lev->fg;
  btyp = init_lev->bg;
  cVar43 = init_lev->smoothed;
  cVar2 = init_lev->joined;
  cVar53 = init_lev->lit;
  cVar3 = init_lev->walled;
  if (cVar53 < '\0') {
    bVar29 = depth(&u.uz);
    uVar31 = mt_random();
    cVar53 = '\0';
    if (uVar31 % (uint)(byte)(((bVar29 ^ (char)bVar29 >> 7) - ((char)bVar29 >> 7)) + 1) < 10) {
      uVar31 = mt_random();
      cVar53 = 0x3531dec < uVar31 * 0x3f2b3885;
    }
  }
  new_locations = (char *)malloc(0x62c);
  if (btyp < '\'') {
    puVar32 = &lev->locations[1][0].field_0x6;
    lVar35 = 1;
    do {
      lVar39 = 0;
      do {
        puVar32[lVar39 + -2] = btyp;
        puVar32[lVar39 + 1] = puVar32[lVar39 + 1] & 0xfb;
        lVar39 = lVar39 + 0xc;
      } while (lVar39 != 0xfc);
      lVar35 = lVar35 + 1;
      puVar32 = puVar32 + 0xfc;
    } while (lVar35 != 0x50);
  }
  if (cVar1 < '\'') {
    lVar35 = 0;
    do {
      uVar31 = mt_random();
      uVar52 = uVar31 % 0x4d + 2;
      uVar31 = mt_random();
      uVar31 = uVar31 % 0x13 + 1;
      if (lev->locations[uVar52][uVar31].typ == btyp) {
        lev->locations[uVar52][uVar31].typ = cVar1;
        lVar35 = lVar35 + 1;
      }
    } while (lVar35 < 0x270);
  }
  lVar35 = 2;
  do {
    lVar39 = 1;
    do {
      lVar46 = 0;
      uVar31 = 0;
      do {
        sVar50 = btyp;
        if ((0xffffffb1 < (dirs[lVar46 * 2] + (int)lVar35) - 0x4fU) &&
           (uVar52 = dirs[lVar46 * 2 + 1] + (int)lVar39, uVar52 < 0x14)) {
          sVar50 = lev->locations[(uint)(dirs[lVar46 * 2] + (int)lVar35)][uVar52].typ;
        }
        uVar31 = uVar31 + (sVar50 == cVar1);
        lVar46 = lVar46 + 1;
      } while (lVar46 != 8);
      cVar45 = cVar1;
      if ((((uVar31 & 0xffff) - 5 < 4) || (cVar45 = btyp, (uVar31 & 0xffff) < 3)) && (cVar45 < '\'')
         ) {
        lev->locations[lVar35][lVar39].typ = cVar45;
      }
      lVar39 = lVar39 + 1;
    } while (lVar39 != 0x14);
    lVar35 = lVar35 + 1;
  } while (lVar35 != 0x4f);
  lVar35 = 2;
  do {
    lVar39 = 1;
    do {
      lVar46 = 0;
      sVar49 = 0;
      do {
        sVar50 = btyp;
        if ((0xffffffb1 < (dirs[lVar46 * 2] + (int)lVar35) - 0x4fU) &&
           (uVar31 = dirs[lVar46 * 2 + 1] + (int)lVar39, uVar31 < 0x14)) {
          sVar50 = lev->locations[(uint)(dirs[lVar46 * 2] + (int)lVar35)][uVar31].typ;
        }
        sVar49 = sVar49 + (ushort)(sVar50 == cVar1);
        lVar46 = lVar46 + 1;
      } while (lVar46 != 8);
      cVar45 = btyp;
      if (sVar49 != 5) {
        cVar45 = lev->locations[lVar35][lVar39].typ;
      }
      new_locations[lVar35 + lVar39 * 0x4f] = cVar45;
      lVar39 = lVar39 + 1;
    } while (lVar39 != 0x14);
    lVar35 = lVar35 + 1;
  } while (lVar35 != 0x4f);
  psVar40 = &lev->locations[2][1].typ;
  pcVar36 = new_locations + 0x51;
  lVar35 = 2;
  do {
    lVar39 = 0;
    pcVar47 = pcVar36;
    do {
      if (*pcVar47 < '\'') {
        psVar40[lVar39] = *pcVar47;
      }
      lVar39 = lVar39 + 0xc;
      pcVar47 = pcVar47 + 0x4f;
    } while (lVar39 != 0xe4);
    lVar35 = lVar35 + 1;
    psVar40 = psVar40 + 0xfc;
    pcVar36 = pcVar36 + 1;
  } while (lVar35 != 0x4f);
  if (cVar43 != '\0') {
    bVar4 = true;
    do {
      bVar37 = bVar4;
      lVar35 = 2;
      do {
        lVar39 = 1;
        do {
          lVar46 = 0;
          sVar49 = 0;
          do {
            cVar43 = btyp;
            if ((0xffffffb1 < (dirs[lVar46 * 2] + (int)lVar35) - 0x4fU) &&
               (uVar31 = dirs[lVar46 * 2 + 1] + (int)lVar39, uVar31 < 0x14)) {
              cVar43 = lev->locations[(uint)(dirs[lVar46 * 2] + (int)lVar35)][uVar31].typ;
            }
            sVar49 = sVar49 + (ushort)(cVar43 == cVar1);
            lVar46 = lVar46 + 1;
          } while (lVar46 != 8);
          cVar43 = btyp;
          if (2 < sVar49) {
            cVar43 = lev->locations[lVar35][lVar39].typ;
          }
          new_locations[lVar35 + lVar39 * 0x4f] = cVar43;
          lVar39 = lVar39 + 1;
        } while (lVar39 != 0x14);
        lVar35 = lVar35 + 1;
      } while (lVar35 != 0x4f);
      pcVar36 = new_locations + 0x51;
      lVar35 = 2;
      psVar40 = &lev->locations[2][1].typ;
      do {
        lVar39 = 0;
        pcVar47 = pcVar36;
        do {
          if (*pcVar47 < '\'') {
            psVar40[lVar39] = *pcVar47;
          }
          lVar39 = lVar39 + 0xc;
          pcVar47 = pcVar47 + 0x4f;
        } while (lVar39 != 0xe4);
        lVar35 = lVar35 + 1;
        psVar40 = psVar40 + 0xfc;
        pcVar36 = pcVar36 + 1;
      } while (lVar35 != 0x4f);
      bVar4 = false;
    } while (bVar37);
  }
  if (cVar2 != '\0') {
    __s = lev->rooms;
    lVar35 = 2;
    do {
      lVar39 = 1;
      do {
        if ((lev->locations[lVar35][lVar39].typ == cVar1) &&
           ((lev->locations[lVar35][lVar39].field_0x8 & 0x3f) == 0)) {
          min_rx = (int)lVar35;
          min_ry = (int)lVar39;
          n_loc_filled = 0;
          max_rx = min_rx;
          max_ry = min_ry;
          flood_fill_rm(lev,min_rx,min_ry,lev->nroom + 3,'\0','\0');
          if (n_loc_filled < 4) {
            if (min_rx <= max_rx) {
              puVar32 = &lev->locations[min_rx][0].field_0x6;
              lVar46 = (long)min_rx;
              iVar38 = max_rx;
              iVar64 = max_ry;
              do {
                if (min_ry <= iVar64) {
                  lVar41 = (long)min_ry + -1;
                  lVar27 = (long)min_ry * 0xc;
                  puVar48 = puVar32;
                  do {
                    if ((*(uint *)(puVar48 + lVar27) >> 0x10 & 0x3f) == lev->nroom + 3U) {
                      puVar48[lVar27 + -2] = btyp;
                      *(uint *)(puVar48 + lVar27) = *(uint *)(puVar48 + lVar27) & 0xffc0ffff;
                      iVar64 = max_ry;
                    }
                    lVar41 = lVar41 + 1;
                    puVar48 = puVar48 + 0xc;
                    iVar38 = max_rx;
                  } while (lVar41 < iVar64);
                }
                puVar32 = puVar32 + 0xfc;
                bVar4 = lVar46 < iVar38;
                lVar46 = lVar46 + 1;
              } while (bVar4);
            }
          }
          else {
            add_room(lev,min_rx,min_ry,max_rx,max_ry,'\0','\0','\x01');
            iVar38 = lev->nroom;
            __s[(long)iVar38 + -1].irregular = '\x01';
            if (0x4f < (long)iVar38) goto LAB_001dc980;
          }
        }
        lVar39 = lVar39 + 1;
      } while (lVar39 != 0x14);
      lVar35 = lVar35 + 1;
    } while (lVar35 != 0x4f);
    uVar42 = (ulong)(uint)lev->nroom;
    if (1 < lev->nroom) {
LAB_001dc980:
      pmVar33 = lev->rooms + 1;
      croom = __s;
      do {
        bVar30 = somexy(lev,croom,&sm);
        if ((bVar30 == '\0') || (bVar30 = somexy(lev,pmVar33,&local_7c), bVar30 == '\0')) {
          impossible("No start/end room loc in join_map.");
          uVar31 = (int)croom->hx - (int)croom->lx;
          sm.x = (char)(((uVar31 & 0xffff) >> 0xf) + uVar31 >> 1) + croom->lx;
          uVar31 = (int)croom->hy - (int)croom->ly;
          sm.y = (char)(((uVar31 & 0xffff) >> 0xf) + uVar31 >> 1) + croom->ly;
          uVar31 = (int)pmVar33->hx - (int)pmVar33->lx;
          local_7c.x = (char)(((uVar31 & 0xffff) >> 0xf) + uVar31 >> 1) + pmVar33->lx;
          uVar31 = (int)pmVar33->hy - (int)pmVar33->ly;
          local_7c.y = (char)(((uVar31 & 0xffff) >> 0xf) + uVar31 >> 1) + pmVar33->ly;
        }
        dig_corridor(lev,&sm,&local_7c,'\0',cVar1,btyp);
        if ((croom->hx < pmVar33->lx) ||
           (((croom->hy < pmVar33->ly || (pmVar33->hy < croom->ly)) &&
            (uVar31 = mt_random(), 0x55555555 < uVar31 * -0x55555555)))) {
          croom = pmVar33;
        }
        pmVar33 = pmVar33 + 1;
        uVar42 = (ulong)lev->nroom;
      } while (pmVar33 < __s + uVar42);
    }
    pmVar33 = __s;
    if (0 < (int)uVar42) {
      do {
        cVar43 = pmVar33->lx;
        cVar45 = pmVar33->hx;
        if (cVar43 <= cVar45) {
          uVar42 = (ulong)(byte)pmVar33->hy;
          puVar32 = &lev->locations[cVar43][0].field_0x6;
          lVar35 = (long)cVar43;
          do {
            cVar43 = pmVar33->ly;
            if (cVar43 <= (char)uVar42) {
              lVar39 = (long)cVar43 + -1;
              puVar48 = puVar32 + (long)cVar43 * 0xc;
              do {
                puVar48[2] = puVar48[2] & 0xc0;
                uVar42 = (ulong)pmVar33->hy;
                lVar39 = lVar39 + 1;
                puVar48 = puVar48 + 0xc;
              } while (lVar39 < (long)uVar42);
              cVar45 = pmVar33->hx;
            }
            puVar32 = puVar32 + 0xfc;
            bVar4 = lVar35 < cVar45;
            lVar35 = lVar35 + 1;
          } while (bVar4);
          uVar42 = (ulong)(uint)lev->nroom;
        }
        pmVar33 = pmVar33 + 1;
      } while (pmVar33 < __s + (int)uVar42);
    }
    memset(__s,0,0x4530);
    lev->rooms[0].hx = -1;
    lev->subrooms->hx = -1;
    lev->nroom = 0;
  }
  if (cVar3 != '\0') {
    lVar35 = 1;
    uVar31 = 0xffffffff;
    lVar39 = 0;
    plVar44 = lev;
    do {
      uVar52 = 2;
      uVar42 = 0;
      do {
        if (lev->locations[lVar35][uVar42].typ == '\0') {
          uVar51 = (int)uVar42 - 1;
          do {
            lVar46 = 0x44;
            uVar34 = uVar31;
            do {
              if (((uVar51 < 0x15) && (uVar34 < 0x4f)) &&
                 (plVar44->levname[lVar46 + (ulong)uVar51 * 0xc] == '\x19')) {
                lev->locations[lVar35][uVar42].typ = '\x02' - (uVar42 == uVar51);
              }
              lVar46 = lVar46 + 0xfc;
              uVar34 = uVar34 + 1;
            } while (lVar46 != 0x338);
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar52);
        }
        uVar42 = uVar42 + 1;
        uVar52 = uVar52 + 1;
      } while (uVar42 != 0x15);
      lVar35 = lVar35 + 1;
      lVar39 = lVar39 + 1;
      plVar44 = (level *)&plVar44->locations[0][0xf].field_0x8;
      uVar31 = uVar31 + 1;
    } while (lVar39 != 0x4f);
  }
  if (cVar53 != '\0') {
    psVar40 = &lev->locations[1][0].typ;
    lVar35 = 1;
    do {
      lVar39 = 0;
      do {
        if ((cVar1 < '\x11') || (psVar40[lVar39] != cVar1)) {
          if ('\x10' < btyp) {
            if (psVar40[lVar39] != btyp) goto LAB_001dcc9f;
            goto LAB_001dccbc;
          }
          if ((btyp == '\r') && (psVar40[lVar39] == '\r')) goto LAB_001dccbc;
LAB_001dcc9f:
          if ((cVar3 != '\0') && (psVar40[lVar39] < '\r' && psVar40[lVar39] != '\0'))
          goto LAB_001dccbc;
        }
        else {
LAB_001dccbc:
          psVar40[lVar39 + 3] = psVar40[lVar39 + 3] | 4;
        }
        auVar28 = _DAT_002aba20;
        lVar39 = lVar39 + 0xc;
      } while (lVar39 != 0xfc);
      lVar35 = lVar35 + 1;
      psVar40 = psVar40 + 0xfc;
    } while (lVar35 != 0x50);
    iVar38 = lev->nroom;
    if (0 < (long)iVar38) {
      lVar35 = (long)iVar38 + -1;
      auVar54._8_4_ = (int)lVar35;
      auVar54._0_8_ = lVar35;
      auVar54._12_4_ = (int)((ulong)lVar35 >> 0x20);
      lVar35 = 0;
      auVar55 = auVar54;
      auVar66 = _DAT_002adfc0;
      auVar67 = _DAT_002adfd0;
      auVar68 = _DAT_002adfe0;
      auVar69 = _DAT_002adff0;
      auVar70 = _DAT_002ae000;
      auVar71 = _DAT_002ae010;
      auVar72 = _DAT_002ae020;
      auVar73 = _DAT_002aba10;
      do {
        auVar83 = auVar54 ^ auVar28;
        auVar87 = auVar73 ^ auVar28;
        iVar64 = auVar83._0_4_;
        iVar100 = -(uint)(iVar64 < auVar87._0_4_);
        iVar65 = auVar83._4_4_;
        auVar89._4_4_ = -(uint)(iVar65 < auVar87._4_4_);
        iVar85 = auVar83._8_4_;
        iVar104 = -(uint)(iVar85 < auVar87._8_4_);
        iVar86 = auVar83._12_4_;
        auVar89._12_4_ = -(uint)(iVar86 < auVar87._12_4_);
        auVar83._4_4_ = iVar100;
        auVar83._0_4_ = iVar100;
        auVar83._8_4_ = iVar104;
        auVar83._12_4_ = iVar104;
        auVar83 = pshuflw(auVar55,auVar83,0xe8);
        auVar88._4_4_ = -(uint)(auVar87._4_4_ == iVar65);
        auVar88._12_4_ = -(uint)(auVar87._12_4_ == iVar86);
        auVar88._0_4_ = auVar88._4_4_;
        auVar88._8_4_ = auVar88._12_4_;
        auVar74 = pshuflw(in_XMM11,auVar88,0xe8);
        auVar89._0_4_ = auVar89._4_4_;
        auVar89._8_4_ = auVar89._12_4_;
        auVar87 = pshuflw(auVar83,auVar89,0xe8);
        auVar55._8_4_ = 0xffffffff;
        auVar55._0_8_ = 0xffffffffffffffff;
        auVar55._12_4_ = 0xffffffff;
        auVar55 = (auVar87 | auVar74 & auVar83) ^ auVar55;
        auVar55 = packssdw(auVar55,auVar55);
        if ((auVar55 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined1 *)((long)lev->rooms[0].sbrooms + lVar35 + -0xb) = 1;
        }
        auVar74._4_4_ = iVar100;
        auVar74._0_4_ = iVar100;
        auVar74._8_4_ = iVar104;
        auVar74._12_4_ = iVar104;
        auVar89 = auVar88 & auVar74 | auVar89;
        auVar55 = packssdw(auVar89,auVar89);
        auVar87._8_4_ = 0xffffffff;
        auVar87._0_8_ = 0xffffffffffffffff;
        auVar87._12_4_ = 0xffffffff;
        auVar55 = packssdw(auVar55 ^ auVar87,auVar55 ^ auVar87);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55._0_4_ >> 8 & 1) != 0) {
          *(undefined1 *)((long)lev->rooms[1].sbrooms + lVar35 + -0xb) = 1;
        }
        auVar55 = auVar72 ^ auVar28;
        auVar75._0_4_ = -(uint)(iVar64 < auVar55._0_4_);
        auVar75._4_4_ = -(uint)(iVar65 < auVar55._4_4_);
        auVar75._8_4_ = -(uint)(iVar85 < auVar55._8_4_);
        auVar75._12_4_ = -(uint)(iVar86 < auVar55._12_4_);
        auVar90._4_4_ = auVar75._0_4_;
        auVar90._0_4_ = auVar75._0_4_;
        auVar90._8_4_ = auVar75._8_4_;
        auVar90._12_4_ = auVar75._8_4_;
        iVar100 = -(uint)(auVar55._4_4_ == iVar65);
        iVar104 = -(uint)(auVar55._12_4_ == iVar86);
        auVar14._4_4_ = iVar100;
        auVar14._0_4_ = iVar100;
        auVar14._8_4_ = iVar104;
        auVar14._12_4_ = iVar104;
        auVar101._4_4_ = auVar75._4_4_;
        auVar101._0_4_ = auVar75._4_4_;
        auVar101._8_4_ = auVar75._12_4_;
        auVar101._12_4_ = auVar75._12_4_;
        auVar55 = auVar14 & auVar90 | auVar101;
        auVar55 = packssdw(auVar55,auVar55);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar55 = packssdw(auVar55 ^ auVar5,auVar55 ^ auVar5);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55._0_4_ >> 0x10 & 1) != 0) {
          *(undefined1 *)((long)lev->rooms[2].sbrooms + lVar35 + -0xb) = 1;
        }
        auVar55 = pshufhw(auVar55,auVar90,0x84);
        auVar15._4_4_ = iVar100;
        auVar15._0_4_ = iVar100;
        auVar15._8_4_ = iVar104;
        auVar15._12_4_ = iVar104;
        auVar87 = pshufhw(auVar75,auVar15,0x84);
        auVar83 = pshufhw(auVar55,auVar101,0x84);
        auVar56._8_4_ = 0xffffffff;
        auVar56._0_8_ = 0xffffffffffffffff;
        auVar56._12_4_ = 0xffffffff;
        auVar56 = (auVar83 | auVar87 & auVar55) ^ auVar56;
        auVar55 = packssdw(auVar56,auVar56);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55._0_4_ >> 0x18 & 1) != 0) {
          *(undefined1 *)((long)lev->rooms[3].sbrooms + lVar35 + -0xb) = 1;
        }
        auVar55 = auVar71 ^ auVar28;
        auVar76._0_4_ = -(uint)(iVar64 < auVar55._0_4_);
        auVar76._4_4_ = -(uint)(iVar65 < auVar55._4_4_);
        auVar76._8_4_ = -(uint)(iVar85 < auVar55._8_4_);
        auVar76._12_4_ = -(uint)(iVar86 < auVar55._12_4_);
        auVar16._4_4_ = auVar76._0_4_;
        auVar16._0_4_ = auVar76._0_4_;
        auVar16._8_4_ = auVar76._8_4_;
        auVar16._12_4_ = auVar76._8_4_;
        auVar87 = pshuflw(auVar101,auVar16,0xe8);
        auVar57._0_4_ = -(uint)(auVar55._0_4_ == iVar64);
        auVar57._4_4_ = -(uint)(auVar55._4_4_ == iVar65);
        auVar57._8_4_ = -(uint)(auVar55._8_4_ == iVar85);
        auVar57._12_4_ = -(uint)(auVar55._12_4_ == iVar86);
        auVar91._4_4_ = auVar57._4_4_;
        auVar91._0_4_ = auVar57._4_4_;
        auVar91._8_4_ = auVar57._12_4_;
        auVar91._12_4_ = auVar57._12_4_;
        auVar55 = pshuflw(auVar57,auVar91,0xe8);
        auVar92._4_4_ = auVar76._4_4_;
        auVar92._0_4_ = auVar76._4_4_;
        auVar92._8_4_ = auVar76._12_4_;
        auVar92._12_4_ = auVar76._12_4_;
        auVar83 = pshuflw(auVar76,auVar92,0xe8);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar55 = packssdw(auVar55 & auVar87,(auVar83 | auVar55 & auVar87) ^ auVar6);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined1 *)((long)lev->rooms[4].sbrooms + lVar35 + -0xb) = 1;
        }
        auVar17._4_4_ = auVar76._0_4_;
        auVar17._0_4_ = auVar76._0_4_;
        auVar17._8_4_ = auVar76._8_4_;
        auVar17._12_4_ = auVar76._8_4_;
        auVar92 = auVar91 & auVar17 | auVar92;
        auVar83 = packssdw(auVar92,auVar92);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar55 = packssdw(auVar55,auVar83 ^ auVar7);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55._4_2_ >> 8 & 1) != 0) {
          *(undefined1 *)((long)lev->rooms[5].sbrooms + lVar35 + -0xb) = 1;
        }
        auVar55 = auVar70 ^ auVar28;
        auVar77._0_4_ = -(uint)(iVar64 < auVar55._0_4_);
        auVar77._4_4_ = -(uint)(iVar65 < auVar55._4_4_);
        auVar77._8_4_ = -(uint)(iVar85 < auVar55._8_4_);
        auVar77._12_4_ = -(uint)(iVar86 < auVar55._12_4_);
        auVar93._4_4_ = auVar77._0_4_;
        auVar93._0_4_ = auVar77._0_4_;
        auVar93._8_4_ = auVar77._8_4_;
        auVar93._12_4_ = auVar77._8_4_;
        iVar100 = -(uint)(auVar55._4_4_ == iVar65);
        iVar104 = -(uint)(auVar55._12_4_ == iVar86);
        auVar18._4_4_ = iVar100;
        auVar18._0_4_ = iVar100;
        auVar18._8_4_ = iVar104;
        auVar18._12_4_ = iVar104;
        auVar102._4_4_ = auVar77._4_4_;
        auVar102._0_4_ = auVar77._4_4_;
        auVar102._8_4_ = auVar77._12_4_;
        auVar102._12_4_ = auVar77._12_4_;
        auVar55 = auVar18 & auVar93 | auVar102;
        auVar55 = packssdw(auVar55,auVar55);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar55 = packssdw(auVar55 ^ auVar8,auVar55 ^ auVar8);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined1 *)((long)lev->rooms[6].sbrooms + lVar35 + -0xb) = 1;
        }
        auVar55 = pshufhw(auVar55,auVar93,0x84);
        auVar19._4_4_ = iVar100;
        auVar19._0_4_ = iVar100;
        auVar19._8_4_ = iVar104;
        auVar19._12_4_ = iVar104;
        auVar87 = pshufhw(auVar77,auVar19,0x84);
        auVar83 = pshufhw(auVar55,auVar102,0x84);
        auVar58._8_4_ = 0xffffffff;
        auVar58._0_8_ = 0xffffffffffffffff;
        auVar58._12_4_ = 0xffffffff;
        auVar58 = (auVar83 | auVar87 & auVar55) ^ auVar58;
        auVar55 = packssdw(auVar58,auVar58);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55._6_2_ >> 8 & 1) != 0) {
          *(undefined1 *)((long)lev->rooms[7].sbrooms + lVar35 + -0xb) = 1;
        }
        auVar55 = auVar69 ^ auVar28;
        auVar78._0_4_ = -(uint)(iVar64 < auVar55._0_4_);
        auVar78._4_4_ = -(uint)(iVar65 < auVar55._4_4_);
        auVar78._8_4_ = -(uint)(iVar85 < auVar55._8_4_);
        auVar78._12_4_ = -(uint)(iVar86 < auVar55._12_4_);
        auVar20._4_4_ = auVar78._0_4_;
        auVar20._0_4_ = auVar78._0_4_;
        auVar20._8_4_ = auVar78._8_4_;
        auVar20._12_4_ = auVar78._8_4_;
        auVar87 = pshuflw(auVar102,auVar20,0xe8);
        auVar59._0_4_ = -(uint)(auVar55._0_4_ == iVar64);
        auVar59._4_4_ = -(uint)(auVar55._4_4_ == iVar65);
        auVar59._8_4_ = -(uint)(auVar55._8_4_ == iVar85);
        auVar59._12_4_ = -(uint)(auVar55._12_4_ == iVar86);
        auVar94._4_4_ = auVar59._4_4_;
        auVar94._0_4_ = auVar59._4_4_;
        auVar94._8_4_ = auVar59._12_4_;
        auVar94._12_4_ = auVar59._12_4_;
        auVar55 = pshuflw(auVar59,auVar94,0xe8);
        auVar95._4_4_ = auVar78._4_4_;
        auVar95._0_4_ = auVar78._4_4_;
        auVar95._8_4_ = auVar78._12_4_;
        auVar95._12_4_ = auVar78._12_4_;
        auVar83 = pshuflw(auVar78,auVar95,0xe8);
        auVar79._8_4_ = 0xffffffff;
        auVar79._0_8_ = 0xffffffffffffffff;
        auVar79._12_4_ = 0xffffffff;
        auVar79 = (auVar83 | auVar55 & auVar87) ^ auVar79;
        auVar83 = packssdw(auVar79,auVar79);
        auVar55 = packsswb(auVar55 & auVar87,auVar83);
        if ((auVar55 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined1 *)((long)lev->rooms[8].sbrooms + lVar35 + -0xb) = 1;
        }
        auVar21._4_4_ = auVar78._0_4_;
        auVar21._0_4_ = auVar78._0_4_;
        auVar21._8_4_ = auVar78._8_4_;
        auVar21._12_4_ = auVar78._8_4_;
        auVar95 = auVar94 & auVar21 | auVar95;
        auVar83 = packssdw(auVar95,auVar95);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar83 = packssdw(auVar83 ^ auVar9,auVar83 ^ auVar9);
        auVar55 = packsswb(auVar55,auVar83);
        if ((auVar55._8_2_ >> 8 & 1) != 0) {
          *(undefined1 *)((long)lev->rooms[9].sbrooms + lVar35 + -0xb) = 1;
        }
        auVar55 = auVar68 ^ auVar28;
        auVar80._0_4_ = -(uint)(iVar64 < auVar55._0_4_);
        auVar80._4_4_ = -(uint)(iVar65 < auVar55._4_4_);
        auVar80._8_4_ = -(uint)(iVar85 < auVar55._8_4_);
        auVar80._12_4_ = -(uint)(iVar86 < auVar55._12_4_);
        auVar96._4_4_ = auVar80._0_4_;
        auVar96._0_4_ = auVar80._0_4_;
        auVar96._8_4_ = auVar80._8_4_;
        auVar96._12_4_ = auVar80._8_4_;
        iVar100 = -(uint)(auVar55._4_4_ == iVar65);
        iVar104 = -(uint)(auVar55._12_4_ == iVar86);
        auVar22._4_4_ = iVar100;
        auVar22._0_4_ = iVar100;
        auVar22._8_4_ = iVar104;
        auVar22._12_4_ = iVar104;
        auVar103._4_4_ = auVar80._4_4_;
        auVar103._0_4_ = auVar80._4_4_;
        auVar103._8_4_ = auVar80._12_4_;
        auVar103._12_4_ = auVar80._12_4_;
        auVar55 = auVar22 & auVar96 | auVar103;
        auVar55 = packssdw(auVar55,auVar55);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar55 = packssdw(auVar55 ^ auVar10,auVar55 ^ auVar10);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(undefined1 *)((long)lev->rooms[10].sbrooms + lVar35 + -0xb) = 1;
        }
        auVar55 = pshufhw(auVar55,auVar96,0x84);
        auVar23._4_4_ = iVar100;
        auVar23._0_4_ = iVar100;
        auVar23._8_4_ = iVar104;
        auVar23._12_4_ = iVar104;
        auVar87 = pshufhw(auVar80,auVar23,0x84);
        auVar83 = pshufhw(auVar55,auVar103,0x84);
        auVar60._8_4_ = 0xffffffff;
        auVar60._0_8_ = 0xffffffffffffffff;
        auVar60._12_4_ = 0xffffffff;
        auVar60 = (auVar83 | auVar87 & auVar55) ^ auVar60;
        auVar55 = packssdw(auVar60,auVar60);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55._10_2_ >> 8 & 1) != 0) {
          *(undefined1 *)((long)lev->rooms[0xb].sbrooms + lVar35 + -0xb) = 1;
        }
        auVar55 = auVar67 ^ auVar28;
        auVar81._0_4_ = -(uint)(iVar64 < auVar55._0_4_);
        auVar81._4_4_ = -(uint)(iVar65 < auVar55._4_4_);
        auVar81._8_4_ = -(uint)(iVar85 < auVar55._8_4_);
        auVar81._12_4_ = -(uint)(iVar86 < auVar55._12_4_);
        auVar24._4_4_ = auVar81._0_4_;
        auVar24._0_4_ = auVar81._0_4_;
        auVar24._8_4_ = auVar81._8_4_;
        auVar24._12_4_ = auVar81._8_4_;
        auVar87 = pshuflw(auVar103,auVar24,0xe8);
        auVar61._0_4_ = -(uint)(auVar55._0_4_ == iVar64);
        auVar61._4_4_ = -(uint)(auVar55._4_4_ == iVar65);
        auVar61._8_4_ = -(uint)(auVar55._8_4_ == iVar85);
        auVar61._12_4_ = -(uint)(auVar55._12_4_ == iVar86);
        auVar97._4_4_ = auVar61._4_4_;
        auVar97._0_4_ = auVar61._4_4_;
        auVar97._8_4_ = auVar61._12_4_;
        auVar97._12_4_ = auVar61._12_4_;
        auVar55 = pshuflw(auVar61,auVar97,0xe8);
        auVar98._4_4_ = auVar81._4_4_;
        auVar98._0_4_ = auVar81._4_4_;
        auVar98._8_4_ = auVar81._12_4_;
        auVar98._12_4_ = auVar81._12_4_;
        auVar83 = pshuflw(auVar81,auVar98,0xe8);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        auVar55 = packssdw(auVar55 & auVar87,(auVar83 | auVar55 & auVar87) ^ auVar11);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined1 *)((long)lev->rooms[0xc].sbrooms + lVar35 + -0xb) = 1;
        }
        auVar25._4_4_ = auVar81._0_4_;
        auVar25._0_4_ = auVar81._0_4_;
        auVar25._8_4_ = auVar81._8_4_;
        auVar25._12_4_ = auVar81._8_4_;
        auVar98 = auVar97 & auVar25 | auVar98;
        auVar83 = packssdw(auVar98,auVar98);
        auVar12._8_4_ = 0xffffffff;
        auVar12._0_8_ = 0xffffffffffffffff;
        auVar12._12_4_ = 0xffffffff;
        auVar55 = packssdw(auVar55,auVar83 ^ auVar12);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55._12_2_ >> 8 & 1) != 0) {
          *(undefined1 *)((long)lev->rooms[0xd].sbrooms + lVar35 + -0xb) = 1;
        }
        auVar55 = auVar66 ^ auVar28;
        auVar82._0_4_ = -(uint)(iVar64 < auVar55._0_4_);
        auVar82._4_4_ = -(uint)(iVar65 < auVar55._4_4_);
        auVar82._8_4_ = -(uint)(iVar85 < auVar55._8_4_);
        auVar82._12_4_ = -(uint)(iVar86 < auVar55._12_4_);
        auVar99._4_4_ = auVar82._0_4_;
        auVar99._0_4_ = auVar82._0_4_;
        auVar99._8_4_ = auVar82._8_4_;
        auVar99._12_4_ = auVar82._8_4_;
        iVar64 = -(uint)(auVar55._4_4_ == iVar65);
        iVar65 = -(uint)(auVar55._12_4_ == iVar86);
        auVar84._4_4_ = iVar64;
        auVar84._0_4_ = iVar64;
        auVar84._8_4_ = iVar65;
        auVar84._12_4_ = iVar65;
        auVar62._4_4_ = auVar82._4_4_;
        auVar62._0_4_ = auVar82._4_4_;
        auVar62._8_4_ = auVar82._12_4_;
        auVar62._12_4_ = auVar82._12_4_;
        auVar62 = auVar84 & auVar99 | auVar62;
        auVar55 = packssdw(auVar62,auVar62);
        auVar13._8_4_ = 0xffffffff;
        auVar13._0_8_ = 0xffffffffffffffff;
        auVar13._12_4_ = 0xffffffff;
        auVar55 = packssdw(auVar55 ^ auVar13,auVar55 ^ auVar13);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined1 *)((long)lev->rooms[0xe].sbrooms + lVar35 + -0xb) = 1;
        }
        auVar55 = pshufhw(auVar55,auVar99,0x84);
        in_XMM11 = pshufhw(auVar82,auVar84,0x84);
        in_XMM11 = in_XMM11 & auVar55;
        auVar26._4_4_ = auVar82._4_4_;
        auVar26._0_4_ = auVar82._4_4_;
        auVar26._8_4_ = auVar82._12_4_;
        auVar26._12_4_ = auVar82._12_4_;
        auVar55 = pshufhw(auVar55,auVar26,0x84);
        auVar63._8_4_ = 0xffffffff;
        auVar63._0_8_ = 0xffffffffffffffff;
        auVar63._12_4_ = 0xffffffff;
        auVar63 = (auVar55 | in_XMM11) ^ auVar63;
        auVar55 = packssdw(auVar63,auVar63);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55._14_2_ >> 8 & 1) != 0) {
          *(undefined1 *)((long)lev->rooms[0xf].sbrooms + lVar35 + -0xb) = 1;
        }
        lVar39 = (long)DAT_002b63b0;
        lVar41 = auVar73._8_8_;
        auVar73._0_8_ = auVar73._0_8_ + lVar39;
        lVar46 = DAT_002b63b0._8_8_;
        auVar73._8_8_ = lVar41 + lVar46;
        lVar41 = auVar72._8_8_;
        auVar72._0_8_ = auVar72._0_8_ + lVar39;
        auVar72._8_8_ = lVar41 + lVar46;
        lVar41 = auVar71._8_8_;
        auVar71._0_8_ = auVar71._0_8_ + lVar39;
        auVar71._8_8_ = lVar41 + lVar46;
        lVar41 = auVar70._8_8_;
        auVar70._0_8_ = auVar70._0_8_ + lVar39;
        auVar70._8_8_ = lVar41 + lVar46;
        lVar41 = auVar69._8_8_;
        auVar69._0_8_ = auVar69._0_8_ + lVar39;
        auVar69._8_8_ = lVar41 + lVar46;
        lVar41 = auVar68._8_8_;
        auVar68._0_8_ = auVar68._0_8_ + lVar39;
        auVar68._8_8_ = lVar41 + lVar46;
        lVar41 = auVar67._8_8_;
        auVar67._0_8_ = auVar67._0_8_ + lVar39;
        auVar67._8_8_ = lVar41 + lVar46;
        lVar41 = auVar66._8_8_;
        auVar66._0_8_ = auVar66._0_8_ + lVar39;
        auVar66._8_8_ = lVar41 + lVar46;
        lVar35 = lVar35 + 0xd80;
        auVar55 = _DAT_002b63b0;
      } while ((ulong)(iVar38 + 0xfU >> 4) * 0xd80 - lVar35 != 0);
    }
  }
  puVar32 = &lev->locations[1][0].field_0x6;
  lVar35 = 1;
  do {
    lVar39 = 0;
    do {
      if (puVar32[lVar39 + -2] == '\x15') {
        puVar32[lVar39 + 1] = puVar32[lVar39 + 1] | 4;
      }
      lVar39 = lVar39 + 0xc;
    } while (lVar39 != 0xfc);
    lVar35 = lVar35 + 1;
    puVar32 = puVar32 + 0xfc;
  } while (lVar35 != 0x50);
  if ((cVar2 != '\0' && cVar3 != '\0') && (-1 < init_lev->filling)) {
    *(uint *)&(lev->flags).field_0x8 = *(uint *)&(lev->flags).field_0x8 & 0xfff5ffff | 0x80000;
    cVar1 = init_lev->filling;
    if (cVar1 < '\'') {
      puVar32 = &lev->locations[1][0].field_0x6;
      lVar35 = 1;
      do {
        lVar39 = 0;
        do {
          if ((puVar32[lVar39 + -2] == btyp) && (puVar32[lVar39 + -2] = cVar1, cVar1 == '\x15')) {
            puVar32[lVar39 + 1] = puVar32[lVar39 + 1] | 4;
          }
          lVar39 = lVar39 + 0xc;
        } while (lVar39 != 0xfc);
        lVar35 = lVar35 + 1;
        puVar32 = puVar32 + 0xfc;
      } while (lVar35 != 0x50);
    }
  }
  free(new_locations);
  return;
}

Assistant:

void mkmap(struct level *lev, lev_init *init_lev)
{
	schar	bg_typ = init_lev->bg,
		fg_typ = init_lev->fg;
	boolean smooth = init_lev->smoothed,
		join = init_lev->joined;
	xchar   lit = init_lev->lit,
		walled = init_lev->walled;
	int i;

	if (lit < 0)
	    lit = (rnd(1+abs(depth(&u.uz))) < 11 && rn2(77)) ? 1 : 0;

	new_locations = malloc((WIDTH+1) * HEIGHT);

	if (bg_typ < MAX_TYPE)
	    init_map(lev, bg_typ);
	init_fill(lev, bg_typ, fg_typ);

	for (i = 0; i < N_P1_ITER; i++)
	    pass_one(lev, bg_typ, fg_typ);

	for (i = 0; i < N_P2_ITER; i++)
	    pass_two(lev, bg_typ, fg_typ);

	if (smooth)
	    for (i = 0; i < N_P3_ITER; i++)
		pass_three(lev, bg_typ, fg_typ);

	if (join)
	    join_map(lev, bg_typ, fg_typ);

	finish_map(lev, fg_typ, bg_typ, (boolean)lit, (boolean)walled);
	/* a walled, joined level is cavernous, not mazelike -dlc
	 *
	 * also, caverns have a defined "inside" and "outside"; the outside
	 * doesn't _have_ to be stone, say, for hell.  so if the player
	 * defined a maze filler originally, go ahead and backfill the
	 * background in with that filler - DSR */
	if (walled && join && init_lev->filling > -1) {
	    lev->flags.is_maze_lev = FALSE;
	    lev->flags.is_cavernous_lev = TRUE;
	    backfill(lev, bg_typ, init_lev->filling);
	}
	free(new_locations);
}